

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void item_discovered(tgestate_t *state,item_t item)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  itemstruct_t *itemstr;
  
  if ((int)CONCAT71(in_register_00000031,item) == 0xff) {
    return;
  }
  bVar4 = item & 0xf;
  queue_message(state,message_ITEM_DISCOVERED);
  bVar3 = 5;
  if (5 < state->morale) {
    bVar3 = state->morale;
  }
  state->morale = bVar3 - 5;
  uVar1 = default_item_locations[bVar4].room_and_flags;
  itemstr = state->item_structs + bVar4;
  itemstr->item_and_flags = itemstr->item_and_flags & 0x7f;
  state->item_structs[bVar4].room_and_flags = uVar1;
  uVar2 = default_item_locations[bVar4].mappos.v;
  state->item_structs[bVar4].mappos.u = default_item_locations[bVar4].mappos.u;
  state->item_structs[bVar4].mappos.v = uVar2;
  if (uVar1 != '\0') {
    state->item_structs[bVar4].mappos.w = '\x05';
    calc_interior_item_isopos(itemstr);
    return;
  }
  state->item_structs[bVar4].mappos.w = '\0';
  calc_exterior_item_isopos(itemstr);
  return;
}

Assistant:

void item_discovered(tgestate_t *state, item_t item)
{
  const default_item_location_t *default_item_location; /* was HL/DE */
  room_t                         room;                  /* was A */
  itemstruct_t                  *itemstruct;            /* was HL/DE */

  assert(state != NULL);

  if (item == item_NONE)
    return;

  /* BUG FIX: 'item' was not masked in the original code. */
  item &= itemstruct_ITEM_MASK;

  ASSERT_ITEM_VALID(item);

  queue_message(state, message_ITEM_DISCOVERED);
  decrease_morale(state, 5);

  default_item_location = &default_item_locations[item];
  room = default_item_location->room_and_flags;

  itemstruct = &state->item_structs[item];
  itemstruct->item_and_flags &= ~itemstruct_ITEM_FLAG_HELD;
  itemstruct->room_and_flags = default_item_location->room_and_flags;
  itemstruct->mappos.u = default_item_location->mappos.u;
  itemstruct->mappos.v = default_item_location->mappos.v;

  if (room == room_0_OUTDOORS)
  {
    /* Conv: The original code assigned 'room' here since it's already zero. */
    itemstruct->mappos.w = 0;
    calc_exterior_item_isopos(itemstruct);
  }
  else
  {
    itemstruct->mappos.w = 5;
    calc_interior_item_isopos(itemstruct);
  }
}